

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

Matcher<const_std::vector<int,_std::allocator<int>_>_&> * __thiscall
testing::internal::UnorderedElementsAreArrayMatcher::operator_cast_to_Matcher
          (Matcher<const_std::vector<int,_std::allocator<int>_>_&> *__return_storage_ptr__,
          UnorderedElementsAreArrayMatcher *this)

{
  UnorderedElementsAreMatcherImpl<std::vector<int,std::allocator<int>>const&> *this_00;
  undefined4 *puVar1;
  
  this_00 = (UnorderedElementsAreMatcherImpl<std::vector<int,std::allocator<int>>const&> *)
            operator_new(0x40);
  UnorderedElementsAreMatcherImpl<std::vector<int,std::allocator<int>>const&>::
  UnorderedElementsAreMatcherImpl<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
            (this_00,*(Flags *)this,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             *(int **)(this + 8),
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             *(int **)(this + 0x10));
  (__return_storage_ptr__->super_MatcherBase<const_std::vector<int,_std::allocator<int>_>_&>).
  vtable_ = (VTable *)
            MatcherBase<std::vector<int,std::allocator<int>>const&>::
            GetVTable<testing::internal::MatcherBase<std::vector<int,std::allocator<int>>const&>::ValuePolicy<testing::MatcherInterface<std::vector<int,std::allocator<int>>const&>const*,true>>()
            ::kVTable;
  puVar1 = (undefined4 *)operator_new(0x10);
  *puVar1 = 1;
  *(UnorderedElementsAreMatcherImpl<std::vector<int,std::allocator<int>>const&> **)(puVar1 + 2) =
       this_00;
  (__return_storage_ptr__->super_MatcherBase<const_std::vector<int,_std::allocator<int>_>_&>).
  buffer_.ptr = puVar1;
  (__return_storage_ptr__->super_MatcherBase<const_std::vector<int,_std::allocator<int>_>_&>).
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0025f188;
  return __return_storage_ptr__;
}

Assistant:

operator Matcher<Container>() const {
    return Matcher<Container>(
        new UnorderedElementsAreMatcherImpl<const Container&>(
            match_flags_, matchers_.begin(), matchers_.end()));
  }